

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

void Lit_Free(Literal_t *lit)

{
  Vec_Str_t *__ptr;
  
  if (lit != (Literal_t *)0x0) {
    if (lit->function != (uint *)0x0) {
      free(lit->function);
      lit->function = (uint *)0x0;
    }
    if (lit->transition != (uint *)0x0) {
      free(lit->transition);
      lit->transition = (uint *)0x0;
    }
    __ptr = lit->expression;
    free(__ptr->pArray);
    free(__ptr);
    free(lit);
    return;
  }
  return;
}

Assistant:

static inline void Lit_Free(Literal_t * lit) {
    if(lit == NULL) {
        return;
    }
//    Abc_Print(-2,"Freeing: %s\n",lit->expression->pArray); 
    ABC_FREE(lit->function);
    ABC_FREE(lit->transition);
    Vec_StrFree(lit->expression);
    ABC_FREE(lit);
}